

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

CopyConst<char,_ElementType<2UL>_> * __thiscall
absl::lts_20240722::container_internal::internal_layout::
LayoutImpl<std::tuple<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>*,unsigned_int,unsigned_char,absl::lts_20240722::container_internal::map_slot_type<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*>,absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>*>,std::integer_sequence<unsigned_long,1ul,0ul,4ul,10ul,11ul>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
::Pointer<2ul,char>(LayoutImpl<std::tuple<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>*,unsigned_int,unsigned_char,absl::lts_20240722::container_internal::map_slot_type<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*>,absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>*>,std::integer_sequence<unsigned_long,1ul,0ul,4ul,10ul,11ul>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
                    *this,char *p)

{
  size_t sVar1;
  size_t alignment;
  char *p_local;
  LayoutImpl<std::tuple<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*,_unsigned_int,_unsigned_char,_absl::lts_20240722::container_internal::map_slot_type<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_1UL,_0UL,_4UL,_10UL,_11UL>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
  *this_local;
  
  if (((ulong)p & 7) == 0) {
    sVar1 = LayoutImpl<std::tuple<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*,_unsigned_int,_unsigned_char,_absl::lts_20240722::container_internal::map_slot_type<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_1UL,_0UL,_4UL,_10UL,_11UL>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
            ::Offset<2UL,_0>((LayoutImpl<std::tuple<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*,_unsigned_int,_unsigned_char,_absl::lts_20240722::container_internal::map_slot_type<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_1UL,_0UL,_4UL,_10UL,_11UL>,_std::integer_sequence<unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL>_>
                              *)this);
    return (CopyConst<char,_ElementType<2UL>_> *)(p + sVar1);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string_view<char>, const google::protobuf::Descriptor *>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string_view<char>, const google::protobuf::Descriptor *, std::less<std::basic_string_view<char>>, std::allocator<std::pair<const std::basic_string_view<char>, const google::protobuf::Descriptor *>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 10, 11>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsi..." /* TRUNCATED STRING LITERAL */
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
    using C = typename std::remove_const<Char>::type;
    static_assert(
        std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
        "The argument must be a pointer to [const] [signed|unsigned] char");
    constexpr size_t alignment = Alignment();
    (void)alignment;
    assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
    return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
  }